

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

SnapContext * __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::NextOpenEntry
          (UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL> *this)

{
  SnapContext *pSVar1;
  SnapContext *entry;
  UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL> *this_local;
  
  if ((this->m_inlineHeadBlock).EndPos < (this->m_inlineHeadBlock).CurrPos) {
    TTDAbort_unrecoverable_error("We are off the end of the array");
  }
  if (0x20 < (ulong)((long)(this->m_inlineHeadBlock).CurrPos -
                    (long)(this->m_inlineHeadBlock).BlockData) / 0x70) {
    TTDAbort_unrecoverable_error("We are off the end of the array");
  }
  if ((this->m_inlineHeadBlock).CurrPos == (this->m_inlineHeadBlock).EndPos) {
    AddArrayLink(this);
  }
  pSVar1 = (this->m_inlineHeadBlock).CurrPos;
  (this->m_inlineHeadBlock).CurrPos = (this->m_inlineHeadBlock).CurrPos + 1;
  return pSVar1;
}

Assistant:

T* NextOpenEntry()
        {
            TTDAssert(this->m_inlineHeadBlock.CurrPos <= this->m_inlineHeadBlock.EndPos, "We are off the end of the array");
            TTDAssert((((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T) <= allocSize, "We are off the end of the array");

            if (this->m_inlineHeadBlock.CurrPos == this->m_inlineHeadBlock.EndPos)
            {
                this->AddArrayLink();
            }

            T* entry = this->m_inlineHeadBlock.CurrPos;
            this->m_inlineHeadBlock.CurrPos++;

            return entry;
        }